

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O0

bool __thiscall
deqp::UniformBlockCase::checkIndexQueries
          (UniformBlockCase *this,deUint32 program,UniformLayout *layout)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  size_type sVar5;
  undefined8 uVar6;
  MessageBuilder *pMVar7;
  MessageBuilder local_1c8;
  int local_44;
  const_reference pvStack_40;
  int queriedNdx;
  BlockLayoutEntry *block;
  int blockNdx;
  bool allOk;
  Functions *gl;
  TestLog *log;
  UniformLayout *layout_local;
  UniformBlockCase *pUStack_10;
  deUint32 program_local;
  UniformBlockCase *this_local;
  
  log = (TestLog *)layout;
  layout_local._4_4_ = program;
  pUStack_10 = this;
  gl = (Functions *)
       tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  _blockNdx = CONCAT44(extraout_var,iVar2);
  block._7_1_ = 1;
  block._0_4_ = 0;
  while( true ) {
    iVar2 = (int)block;
    sVar5 = std::vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>::
            size((vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_> *)
                 log);
    if ((int)sVar5 <= iVar2) break;
    pvStack_40 = std::
                 vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>::
                 operator[]((vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                             *)log,(long)(int)block);
    dVar3 = layout_local._4_4_;
    pcVar1 = *(code **)(_blockNdx + 0xb38);
    uVar6 = std::__cxx11::string::c_str();
    local_44 = (*pcVar1)(dVar3,uVar6);
    if (local_44 != (int)block) {
      tcu::TestLog::operator<<(&local_1c8,(TestLog *)gl,(BeginMessageToken *)&tcu::TestLog::Message)
      ;
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_1c8,(char (*) [31])"ERROR: glGetUniformBlockIndex(");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&pvStack_40->name);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])0x2c59534);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_44);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])0x2c16365);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)&block);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2aed713);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1c8);
      block._7_1_ = 0;
    }
    dVar3 = (**(code **)(_blockNdx + 0x800))();
    glu::checkError(dVar3,"glGetUniformBlockIndex()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                    ,0x741);
    block._0_4_ = (int)block + 1;
  }
  return (bool)(block._7_1_ & 1);
}

Assistant:

bool UniformBlockCase::checkIndexQueries(deUint32 program, const UniformLayout& layout) const
{
	tcu::TestLog&		  log   = m_testCtx.getLog();
	const glw::Functions& gl	= m_context.getRenderContext().getFunctions();
	bool				  allOk = true;

	// \note Spec mandates that uniform blocks are assigned consecutive locations from 0
	//       to ACTIVE_UNIFORM_BLOCKS. BlockLayoutEntries are stored in that order in UniformLayout.
	for (int blockNdx = 0; blockNdx < (int)layout.blocks.size(); blockNdx++)
	{
		const BlockLayoutEntry& block	  = layout.blocks[blockNdx];
		const int				queriedNdx = gl.getUniformBlockIndex(program, block.name.c_str());

		if (queriedNdx != blockNdx)
		{
			log << TestLog::Message << "ERROR: glGetUniformBlockIndex(" << block.name << ") returned " << queriedNdx
				<< ", expected " << blockNdx << "!" << TestLog::EndMessage;
			allOk = false;
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformBlockIndex()");
	}

	return allOk;
}